

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h
# Opt level: O3

TPZTransform<double> * __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoCube>::GetTransform
          (TPZTransform<double> *__return_storage_ptr__,TPZGeoElRefPattern<pzgeom::TPZGeoCube> *this
          ,int side,int son)

{
  TPZReference *pTVar1;
  TPZTransform<double> trf;
  TPZAutoPointer<TPZRefPattern> local_1c8;
  TPZTransform<double> local_1c0;
  
  TPZTransform<double>::TPZTransform(&local_1c0);
  pTVar1 = (this->fRefPattern).fRef;
  if ((pTVar1 == (TPZReference *)0x0) || (pTVar1->fPointer == (TPZRefPattern *)0x0)) {
    TPZTransform<double>::TPZTransform(__return_storage_ptr__,&local_1c0);
  }
  else {
    (**(code **)(*(long *)&(this->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).super_TPZGeoEl + 0x2b0)
    )(&local_1c8,this);
    TPZRefPattern::Transform(__return_storage_ptr__,(local_1c8.fRef)->fPointer,side,son);
    TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer(&local_1c8);
  }
  TPZTransform<double>::~TPZTransform(&local_1c0);
  return __return_storage_ptr__;
}

Assistant:

TPZTransform<> TPZGeoElRefPattern<TGeo>::GetTransform(int side,int son){
	TPZTransform<> trf;
	if(!fRefPattern) return trf;
	return this->GetRefPattern()->Transform(side,son);
}